

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_cursor.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_to(basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
       basic_json_visitor<char> *visitor)

{
  ser_error *this_00;
  error_code ec_00;
  error_code ec;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[6])(this,visitor,&ec);
  if (ec._M_value == 0) {
    return;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  ec_00._4_4_ = 0;
  ec_00._M_value = ec._M_value;
  ec_00._M_cat = ec._M_cat;
  ser_error::ser_error(this_00,ec_00,0,(this->parser_).source_.position_);
  __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void read_to(basic_json_visitor<char_type>& visitor) override
    {
        std::error_code ec;
        read_to(visitor, ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec,parser_.line(),parser_.column()));
        }
    }